

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QToolBarAreaLayout::takeAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  long lVar2;
  pointer pQVar3;
  qsizetype i;
  ulong i_00;
  QToolBarAreaLayoutInfo *this_00;
  long lVar4;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  do {
    if (this->docks[lVar4].lines.d.size != 0) {
      this_00 = this->docks + lVar4;
      i_00 = 0;
      do {
        pQVar3 = QList<QToolBarAreaLayoutLine>::data(&this_00->lines);
        lVar2 = pQVar3[i_00].toolBarItems.d.size;
        if (lVar2 != 0) {
          iVar1 = *x;
          i = 0;
          do {
            if ((iVar1 - index) + (int)i == 0) {
              *x = iVar1 + (int)i + 1;
              QList<QToolBarAreaLayoutItem>::takeAt(&local_50,&pQVar3[i_00].toolBarItems,i);
              if (pQVar3[i_00].toolBarItems.d.size == 0) {
                QList<QToolBarAreaLayoutLine>::removeAt(&this_00->lines,i_00);
              }
              goto LAB_004b0ef7;
            }
            i = i + 1;
          } while (lVar2 != i);
          *x = iVar1 + (int)i;
        }
        i_00 = i_00 + 1;
      } while (i_00 < (ulong)(this_00->lines).d.size);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_50.widgetItem = (QLayoutItem *)0x0;
LAB_004b0ef7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_50.widgetItem;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QToolBarAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index) {
                    QLayoutItem *result = line.toolBarItems.takeAt(k).widgetItem;
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return result;
                }
            }
        }
    }

    return nullptr;
}